

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::checksegments(tetgenmesh *this)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  verttype vVar11;
  point pdVar12;
  point pdVar13;
  point pdVar14;
  point pdVar15;
  shellface sptr;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar16;
  int local_b8;
  uint local_b4;
  int i;
  int horrors;
  int t1ver;
  int miscount;
  point pb;
  point pa;
  face checkseg;
  face sseg;
  face checksh;
  face spinsh;
  face neighsh;
  shellface *segs;
  triface spintet;
  triface neightet;
  triface tetloop;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&segs);
  face::face((face *)&spinsh.shver);
  face::face((face *)&checksh.shver);
  face::face((face *)&sseg.shver);
  face::face((face *)&checkseg.shver);
  face::face((face *)&pa);
  if (this->b->quiet == 0) {
    printf("  Checking tet->seg connections...\n");
  }
  local_b4 = 0;
  memorypool::traversalinit(this->tetrahedrons);
  neightet._8_8_ = tetrahedrontraverse(this);
  while (neightet._8_8_ != 0) {
    if (*(long *)(neightet._8_8_ + 0x40) != 0) {
      lVar1 = *(long *)(neightet._8_8_ + 0x40);
      for (local_b8 = 0; local_b8 < 6; local_b8 = local_b8 + 1) {
        sdecode(this,*(shellface *)(lVar1 + (long)local_b8 * 8),(face *)&checkseg.shver);
        if (checkseg._8_8_ != 0) {
          pdVar14 = *(point *)(checkseg._8_8_ + 0x18);
          pdVar15 = *(point *)(checkseg._8_8_ + 0x20);
          pdVar12 = org(this,(triface *)&neightet.ver);
          if (((pdVar12 == pdVar14) &&
              (pdVar12 = dest(this,(triface *)&neightet.ver), pdVar12 == pdVar15)) ||
             ((pdVar12 = org(this,(triface *)&neightet.ver), pdVar12 == pdVar15 &&
              (pdVar12 = dest(this,(triface *)&neightet.ver), pdVar12 == pdVar14)))) {
            triface::operator=((triface *)&spintet.ver,(triface *)&neightet.ver);
            do {
              tsspivot1(this,(triface *)&spintet.ver,(face *)&pa);
              if (pa != (point)checkseg._8_8_) {
                printf("  !! Wrong tet->seg connection.\n");
                uVar2 = spintet._8_8_;
                pdVar12 = org(this,(triface *)&spintet.ver);
                uVar4 = pointmark(this,pdVar12);
                pdVar12 = dest(this,(triface *)&spintet.ver);
                uVar5 = pointmark(this,pdVar12);
                pdVar12 = apex(this,(triface *)&spintet.ver);
                uVar6 = pointmark(this,pdVar12);
                pdVar12 = oppo(this,(triface *)&spintet.ver);
                uVar7 = pointmark(this,pdVar12);
                printf("    Tet: x%lx (%d, %d, %d, %d) - ",uVar2,(ulong)uVar4,(ulong)uVar5,
                       (ulong)uVar6,(ulong)uVar7);
                pdVar12 = pa;
                if (pa == (point)0x0) {
                  printf("Seg: NULL.\n");
                }
                else {
                  pdVar13 = sorg(this,(face *)&pa);
                  uVar4 = pointmark(this,pdVar13);
                  pdVar13 = sdest(this,(face *)&pa);
                  uVar5 = pointmark(this,pdVar13);
                  printf("Seg x%lx (%d, %d).\n",pdVar12,(ulong)uVar4,(ulong)uVar5);
                }
                local_b4 = local_b4 + 1;
              }
              iVar8 = (int)neightet.tet;
              decode(this,*(tetrahedron *)(spintet._8_8_ + (long)facepivot1[(int)neightet.tet] * 8),
                     (triface *)&spintet.ver);
              neightet.tet._0_4_ = facepivot2[iVar8][(int)neightet.tet];
            } while (spintet._8_8_ != neightet._8_8_);
          }
          else {
            printf("  !! Wrong tet-seg connection.\n");
            uVar2 = neightet._8_8_;
            pdVar12 = org(this,(triface *)&neightet.ver);
            uVar4 = pointmark(this,pdVar12);
            pdVar12 = dest(this,(triface *)&neightet.ver);
            uVar5 = pointmark(this,pdVar12);
            pdVar12 = apex(this,(triface *)&neightet.ver);
            uVar6 = pointmark(this,pdVar12);
            pdVar12 = oppo(this,(triface *)&neightet.ver);
            uVar7 = pointmark(this,pdVar12);
            in_stack_fffffffffffffe68 = checkseg._8_8_;
            iVar8 = pointmark(this,pdVar14);
            iVar9 = pointmark(this,pdVar15);
            printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n",uVar2,(ulong)uVar4,
                   (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,in_stack_fffffffffffffe68,iVar8,iVar9);
            local_b4 = local_b4 + 1;
          }
          sstpivot1(this,(face *)&checkseg.shver,(triface *)&spintet.ver);
          if (spintet._8_8_ == 0) {
            printf("  !! Wrong seg->tet connection (A NULL tet).\n");
            local_b4 = local_b4 + 1;
          }
          else {
            pdVar12 = org(this,(triface *)&spintet.ver);
            if (((pdVar12 != pdVar14) ||
                (pdVar12 = dest(this,(triface *)&spintet.ver), pdVar12 != pdVar15)) &&
               ((pdVar12 = org(this,(triface *)&spintet.ver), pdVar12 != pdVar15 ||
                (pdVar12 = dest(this,(triface *)&spintet.ver), pdVar12 != pdVar14)))) {
              printf("  !! Wrong seg->tet connection (Wrong edge).\n");
              uVar2 = spintet._8_8_;
              pdVar12 = org(this,(triface *)&spintet.ver);
              uVar4 = pointmark(this,pdVar12);
              pdVar12 = dest(this,(triface *)&spintet.ver);
              uVar5 = pointmark(this,pdVar12);
              pdVar12 = apex(this,(triface *)&spintet.ver);
              uVar6 = pointmark(this,pdVar12);
              pdVar12 = oppo(this,(triface *)&spintet.ver);
              uVar7 = pointmark(this,pdVar12);
              in_stack_fffffffffffffe68 = checkseg._8_8_;
              iVar8 = pointmark(this,pdVar14);
              iVar9 = pointmark(this,pdVar15);
              printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n",uVar2,(ulong)uVar4,
                     (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,in_stack_fffffffffffffe68,iVar8,iVar9);
              local_b4 = local_b4 + 1;
            }
          }
        }
      }
    }
    spintet.ver = neightet.ver;
    spintet._12_4_ = neightet._12_4_;
    for (local_b8 = 0; local_b8 < 6; local_b8 = local_b8 + 1) {
      neightet.tet._0_4_ = edge2ver[local_b8];
      bVar3 = edgemarked(this,(triface *)&spintet.ver);
      uVar16 = SUB84(in_stack_fffffffffffffe68,4);
      if (bVar3) {
        pdVar14 = org(this,(triface *)&spintet.ver);
        uVar4 = pointmark(this,pdVar14);
        pdVar14 = dest(this,(triface *)&spintet.ver);
        uVar5 = pointmark(this,pdVar14);
        pdVar14 = apex(this,(triface *)&spintet.ver);
        uVar6 = pointmark(this,pdVar14);
        pdVar14 = oppo(this,(triface *)&spintet.ver);
        uVar7 = pointmark(this,pdVar14);
        in_stack_fffffffffffffe68._4_4_ = uVar16;
        in_stack_fffffffffffffe68._0_4_ = (int)neightet.tet;
        printf("  !! A marked edge: (%d, %d, %d, %d) -- x%lx %d.\n",(ulong)uVar4,(ulong)uVar5,
               (ulong)uVar6,(ulong)uVar7,spintet._8_8_,in_stack_fffffffffffffe68);
        triface::operator=((triface *)&segs,(triface *)&spintet.ver);
        do {
          iVar8 = (int)spintet.tet;
          decode(this,segs[facepivot1[(int)spintet.tet]],(triface *)&segs);
          spintet.tet._0_4_ = facepivot2[iVar8][(int)spintet.tet];
          bVar3 = edgemarked(this,(triface *)&segs);
          uVar16 = SUB84(in_stack_fffffffffffffe68,4);
          if (!bVar3) {
            pdVar14 = org(this,(triface *)&segs);
            uVar4 = pointmark(this,pdVar14);
            pdVar14 = dest(this,(triface *)&segs);
            uVar5 = pointmark(this,pdVar14);
            pdVar14 = apex(this,(triface *)&segs);
            uVar6 = pointmark(this,pdVar14);
            pdVar14 = oppo(this,(triface *)&segs);
            uVar7 = pointmark(this,pdVar14);
            in_stack_fffffffffffffe68._4_4_ = uVar16;
            in_stack_fffffffffffffe68._0_4_ = (int)spintet.tet;
            printf("  !! !! An unmarked edge (%d, %d, %d, %d) -- x%lx %d.\n",(ulong)uVar4,
                   (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,segs,in_stack_fffffffffffffe68);
            local_b4 = local_b4 + 1;
          }
        } while (segs != (shellface *)spintet._8_8_);
      }
    }
    neightet._8_8_ = tetrahedrontraverse(this);
  }
  if (this->b->quiet == 0) {
    printf("  Checking seg->tet connections...\n");
  }
  horrors = 0;
  memorypool::traversalinit(this->subsegs);
  sseg.sh._0_4_ = 0;
  checkseg._8_8_ = shellfacetraverse(this,this->subsegs);
  do {
    if (checkseg._8_8_ == 0) {
      if (this->b->quiet == 0) {
        printf("  Checking seg->seg connections...\n");
      }
      memorypool::traversalinit(this->points);
      pb = pointtraverse(this);
      while (pb != (point)0x0) {
        vVar11 = pointtype(this,pb);
        if (vVar11 == FREESEGVERTEX) {
          sptr = point2sh(this,pb);
          sdecode(this,sptr,(face *)&checkseg.shver);
          if ((checkseg._8_8_ == 0) || (*(long *)(checkseg._8_8_ + 0x18) == 0)) {
            uVar4 = pointmark(this,pb);
            printf("  !! Dead point-to-seg pointer at point %d.\n",(ulong)uVar4);
            local_b4 = local_b4 + 1;
          }
          else {
            sseg.sh._0_4_ = 0;
            pdVar14 = sorg(this,(face *)&checkseg.shver);
            if (pdVar14 == pb) {
              senext2(this,(face *)&checkseg.shver,(face *)&pa);
              if ((pa == (point)0x0) || (pa[3] == 0.0)) {
                uVar4 = pointmark(this,pb);
                printf("  !! Dead seg-seg connection at point %d.\n",(ulong)uVar4);
                local_b4 = local_b4 + 1;
              }
              else {
                spivotself(this,(face *)&pa);
                checkseg.sh._0_4_ = 0;
                pdVar14 = sdest(this,(face *)&pa);
                if (pdVar14 != pb) {
                  uVar4 = pointmark(this,pb);
                  printf("  !! Wrong seg-seg connection at point %d.\n",(ulong)uVar4);
                  local_b4 = local_b4 + 1;
                }
              }
            }
            else {
              pdVar14 = sdest(this,(face *)&checkseg.shver);
              if (pdVar14 == pb) {
                senext(this,(face *)&checkseg.shver,(face *)&pa);
                if ((pa == (point)0x0) || (pa[3] == 0.0)) {
                  uVar4 = pointmark(this,pb);
                  printf("  !! Dead seg-seg connection at point %d.\n",(ulong)uVar4);
                  local_b4 = local_b4 + 1;
                }
                else {
                  spivotself(this,(face *)&pa);
                  checkseg.sh._0_4_ = 0;
                  pdVar14 = sorg(this,(face *)&pa);
                  if (pdVar14 != pb) {
                    uVar4 = pointmark(this,pb);
                    printf("  !! Wrong seg-seg connection at point %d.\n",(ulong)uVar4);
                    local_b4 = local_b4 + 1;
                  }
                }
              }
              else {
                uVar4 = pointmark(this,pb);
                printf("  !! Wrong point-to-seg pointer at point %d.\n",(ulong)uVar4);
                local_b4 = local_b4 + 1;
              }
            }
          }
        }
        pb = pointtraverse(this);
      }
      if (local_b4 == 0) {
        printf("  Segments are connected properly.\n");
      }
      else {
        printf("  !! !! !! !! Found %d missing connections.\n",(ulong)local_b4);
      }
      if (0 < horrors) {
        printf("  !! !! Found %d missing segments.\n",(ulong)(uint)horrors);
      }
      return local_b4;
    }
    pdVar14 = sorg(this,(face *)&checkseg.shver);
    pdVar15 = sdest(this,(face *)&checkseg.shver);
    spivot(this,(face *)&checkseg.shver,(face *)&spinsh.shver);
    if (spinsh._8_8_ != 0) {
      face::operator=((face *)&checksh.shver,(face *)&spinsh.shver);
      while (((pdVar12 = sorg(this,(face *)&checksh.shver), pdVar12 == pdVar14 &&
              (pdVar12 = sdest(this,(face *)&checksh.shver), pdVar12 == pdVar15)) ||
             ((pdVar12 = sorg(this,(face *)&checksh.shver), pdVar12 == pdVar15 &&
              (pdVar12 = sdest(this,(face *)&checksh.shver), pdVar12 == pdVar14))))) {
        stpivot(this,(face *)&checksh.shver,(triface *)&segs);
        if (segs != (shellface *)0x0) {
          do {
            tsspivot1(this,(triface *)&segs,(face *)&pa);
            uVar16 = SUB84(in_stack_fffffffffffffe68,4);
            if (pa == (point)0x0) {
              pdVar12 = org(this,(triface *)&segs);
              uVar4 = pointmark(this,pdVar12);
              pdVar12 = dest(this,(triface *)&segs);
              uVar5 = pointmark(this,pdVar12);
              pdVar12 = apex(this,(triface *)&segs);
              uVar6 = pointmark(this,pdVar12);
              pdVar12 = oppo(this,(triface *)&segs);
              uVar7 = pointmark(this,pdVar12);
              in_stack_fffffffffffffe68._4_4_ = uVar16;
              in_stack_fffffffffffffe68._0_4_ = (int)spintet.tet;
              printf("  !! !! No seg at tet (%d, %d, %d, %d) -- x%lx %d\n",(ulong)uVar4,(ulong)uVar5
                     ,(ulong)uVar6,(ulong)uVar7,segs,in_stack_fffffffffffffe68);
              local_b4 = local_b4 + 1;
            }
            uVar16 = SUB84(in_stack_fffffffffffffe68,4);
            if (pa != (point)checkseg._8_8_) {
              pdVar12 = sorg(this,(face *)&pa);
              uVar4 = pointmark(this,pdVar12);
              pdVar12 = sdest(this,(face *)&pa);
              uVar5 = pointmark(this,pdVar12);
              pdVar12 = org(this,(triface *)&segs);
              uVar6 = pointmark(this,pdVar12);
              pdVar12 = dest(this,(triface *)&segs);
              uVar7 = pointmark(this,pdVar12);
              pdVar12 = apex(this,(triface *)&segs);
              uVar10 = pointmark(this,pdVar12);
              pdVar12 = oppo(this,(triface *)&segs);
              iVar8 = pointmark(this,pdVar12);
              in_stack_fffffffffffffe68._4_4_ = uVar16;
              in_stack_fffffffffffffe68._0_4_ = iVar8;
              printf("  !! !! Wrong seg (%d, %d) at tet (%d, %d, %d, %d)\n",(ulong)uVar4,
                     (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar10,in_stack_fffffffffffffe68)
              ;
              local_b4 = local_b4 + 1;
            }
            iVar8 = (int)spintet.tet;
            decode(this,segs[facepivot1[(int)spintet.tet]],(triface *)&segs);
            spintet.tet._0_4_ = facepivot2[iVar8][(int)spintet.tet];
            tspivot(this,(triface *)&segs,(face *)&sseg.shver);
          } while (sseg._8_8_ == 0);
        }
        spivotself(this,(face *)&checksh.shver);
        if ((checksh._8_8_ == 0) || (checksh._8_8_ == spinsh._8_8_)) goto LAB_00171a0a;
      }
      pdVar14 = sorg(this,(face *)&checksh.shver);
      uVar4 = pointmark(this,pdVar14);
      pdVar14 = sdest(this,(face *)&checksh.shver);
      uVar5 = pointmark(this,pdVar14);
      pdVar14 = sapex(this,(face *)&checksh.shver);
      uVar6 = pointmark(this,pdVar14);
      printf("  !! Wrong seg-subface (%d, %d, %d) -- x%lx %d connect\n",(ulong)uVar4,(ulong)uVar5,
             (ulong)uVar6,checksh._8_8_,(ulong)(uint)spinsh.sh);
      local_b4 = local_b4 + 1;
    }
LAB_00171a0a:
    sstpivot1(this,(face *)&checkseg.shver,(triface *)&spintet.ver);
    if (spintet._8_8_ == 0) {
      horrors = horrors + 1;
    }
    checkseg._8_8_ = shellfacetraverse(this,this->subsegs);
  } while( true );
}

Assistant:

int tetgenmesh::checksegments()
{
  triface tetloop, neightet, spintet;
  shellface *segs;
  face neighsh, spinsh, checksh;
  face sseg, checkseg;
  point pa, pb;
  int miscount;
  int t1ver;
  int horrors, i;


  if (!b->quiet) {
    printf("  Checking tet->seg connections...\n");
  }

  horrors = 0;
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != NULL) {
    // Loop the six edges of the tet.
    if (tetloop.tet[8] != NULL) {
      segs = (shellface *) tetloop.tet[8];
      for (i = 0; i < 6; i++) {
        sdecode(segs[i], sseg);
        if (sseg.sh != NULL) {
          // Get the edge of the tet.
          tetloop.ver = edge2ver[i];
          // Check if they are the same edge.
          pa = (point) sseg.sh[3];
          pb = (point) sseg.sh[4];
          if (!(((org(tetloop) == pa) && (dest(tetloop) == pb)) ||
                ((org(tetloop) == pb) && (dest(tetloop) == pa)))) {
            printf("  !! Wrong tet-seg connection.\n");
            printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n", 
                   (uintptr_t) tetloop.tet, pointmark(org(tetloop)),
                   pointmark(dest(tetloop)), pointmark(apex(tetloop)),
                   pointmark(oppo(tetloop)), (uintptr_t) sseg.sh,
                   pointmark(pa), pointmark(pb));
            horrors++;
          } else {
            // Loop all tets sharing at this edge.
            neightet = tetloop;
            do {
              tsspivot1(neightet, checkseg);
              if (checkseg.sh != sseg.sh) {
                printf("  !! Wrong tet->seg connection.\n");
                printf("    Tet: x%lx (%d, %d, %d, %d) - ", 
                       (uintptr_t) neightet.tet, pointmark(org(neightet)),
                       pointmark(dest(neightet)), pointmark(apex(neightet)),
                       pointmark(oppo(neightet)));
                if (checkseg.sh != NULL) {
                  printf("Seg x%lx (%d, %d).\n", (uintptr_t) checkseg.sh,
                         pointmark(sorg(checkseg)),pointmark(sdest(checkseg))); 
                } else {
                  printf("Seg: NULL.\n");
                }
                horrors++;
              }
              fnextself(neightet);
            } while (neightet.tet != tetloop.tet);
          }
          // Check the seg->tet pointer.
          sstpivot1(sseg, neightet);
          if (neightet.tet == NULL) {
            printf("  !! Wrong seg->tet connection (A NULL tet).\n");
            horrors++;
          } else {
            if (!(((org(neightet) == pa) && (dest(neightet) == pb)) ||
                ((org(neightet) == pb) && (dest(neightet) == pa)))) {
              printf("  !! Wrong seg->tet connection (Wrong edge).\n");
              printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n", 
                     (uintptr_t) neightet.tet, pointmark(org(neightet)),
                     pointmark(dest(neightet)), pointmark(apex(neightet)),
                     pointmark(oppo(neightet)), (uintptr_t) sseg.sh,
                     pointmark(pa), pointmark(pb));
              horrors++;
            }
          }
        }
      }
    }
    // Loop the six edge of this tet.
    neightet.tet = tetloop.tet;
    for (i = 0; i < 6; i++) {
      neightet.ver = edge2ver[i];
      if (edgemarked(neightet)) {
        // A possible bug. Report it.
        printf("  !! A marked edge: (%d, %d, %d, %d) -- x%lx %d.\n",
               pointmark(org(neightet)), pointmark(dest(neightet)),
               pointmark(apex(neightet)), pointmark(oppo(neightet)),
               (uintptr_t) neightet.tet, neightet.ver);
        // Check if all tets at the edge are marked.
        spintet = neightet;
        while (1) {
          fnextself(spintet);
          if (!edgemarked(spintet)) {
            printf("  !! !! An unmarked edge (%d, %d, %d, %d) -- x%lx %d.\n",
                   pointmark(org(spintet)), pointmark(dest(spintet)),
                   pointmark(apex(spintet)), pointmark(oppo(spintet)),
                   (uintptr_t) spintet.tet, spintet.ver);
            horrors++;
          }
          if (spintet.tet == neightet.tet) break;
        }
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (!b->quiet) {
    printf("  Checking seg->tet connections...\n");
  }

  miscount = 0; // Count the number of unrecovered segments.
  subsegs->traversalinit();
  sseg.shver = 0;
  sseg.sh = shellfacetraverse(subsegs);
  while (sseg.sh != NULL) {
    pa = sorg(sseg);
    pb = sdest(sseg);
    spivot(sseg, neighsh);
    if (neighsh.sh != NULL) {      
      spinsh = neighsh;
      while (1) {
        // Check seg-subface bond.
        if (((sorg(spinsh) == pa) && (sdest(spinsh) == pb)) ||
	    ((sorg(spinsh) == pb) && (sdest(spinsh) == pa))) {
          // Keep the same rotate direction.
          //if (sorg(spinsh) != pa) {          
          //  sesymself(spinsh);
          //  printf("  !! Wrong ori at subface (%d, %d, %d) -- x%lx %d\n",
          //         pointmark(sorg(spinsh)), pointmark(sdest(spinsh)),
          //         pointmark(sapex(spinsh)), (uintptr_t) spinsh.sh,
          //         spinsh.shver);
          //  horrors++;
          //}
          stpivot(spinsh, spintet);
          if (spintet.tet != NULL) {
            // Check if all tets at this segment.
            while (1) {
              tsspivot1(spintet, checkseg);
              if (checkseg.sh == NULL) {
                printf("  !! !! No seg at tet (%d, %d, %d, %d) -- x%lx %d\n",
                       pointmark(org(spintet)), pointmark(dest(spintet)),
                       pointmark(apex(spintet)), pointmark(oppo(spintet)),
                       (uintptr_t) spintet.tet, spintet.ver);
                horrors++;
              }
              if (checkseg.sh != sseg.sh) {
                printf("  !! !! Wrong seg (%d, %d) at tet (%d, %d, %d, %d)\n",
                       pointmark(sorg(checkseg)), pointmark(sdest(checkseg)),
                       pointmark(org(spintet)), pointmark(dest(spintet)),
                       pointmark(apex(spintet)), pointmark(oppo(spintet)));
                horrors++;
              }
              fnextself(spintet);
              // Stop at the next subface.
              tspivot(spintet, checksh);
              if (checksh.sh != NULL) break;
            } // while (1)
          }
        } else { 
          printf("  !! Wrong seg-subface (%d, %d, %d) -- x%lx %d connect\n",
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)),
                 pointmark(sapex(spinsh)), (uintptr_t) spinsh.sh,
                 spinsh.shver);
          horrors++;
          break;
        } // if pa, pb
        spivotself(spinsh);
        if (spinsh.sh == NULL) break; // A dangling segment.
        if (spinsh.sh == neighsh.sh) break;
      } // while (1)
    } // if (neighsh.sh != NULL)
    // Count the number of "un-recovered" segments.
    sstpivot1(sseg, neightet);
    if (neightet.tet == NULL) {
      miscount++;
    }
    sseg.sh = shellfacetraverse(subsegs);
  }

  if (!b->quiet) {
    printf("  Checking seg->seg connections...\n");
  }

  points->traversalinit();
  pa = pointtraverse();
  while (pa != NULL) {
    if (pointtype(pa) == FREESEGVERTEX) {
      // There should be two subsegments connected at 'pa'.
      // Get a subsegment containing 'pa'.
      sdecode(point2sh(pa), sseg);
      if ((sseg.sh == NULL) || sseg.sh[3] == NULL) {
        printf("  !! Dead point-to-seg pointer at point %d.\n",
               pointmark(pa));
        horrors++;
      } else {
        sseg.shver = 0;
        if (sorg(sseg) != pa) {
          if (sdest(sseg) != pa) {
            printf("  !! Wrong point-to-seg pointer at point %d.\n",
                   pointmark(pa));
            horrors++;
          } else {
            // Find the next subsegment at 'pa'.
            senext(sseg, checkseg);
            if ((checkseg.sh == NULL) || (checkseg.sh[3] == NULL)) {
              printf("  !! Dead seg-seg connection at point %d.\n",
                     pointmark(pa));
              horrors++;
            } else {
              spivotself(checkseg);
              checkseg.shver = 0;
              if (sorg(checkseg) != pa) {
                printf("  !! Wrong seg-seg connection at point %d.\n",
                     pointmark(pa));
                horrors++;
              }
            }
          }
        } else {
          // Find the previous subsegment at 'pa'.
          senext2(sseg, checkseg);
          if ((checkseg.sh == NULL) || (checkseg.sh[3] == NULL)) {
            printf("  !! Dead seg-seg connection at point %d.\n",
                   pointmark(pa));
            horrors++;
          } else {
            spivotself(checkseg);
            checkseg.shver = 0;
            if (sdest(checkseg) != pa) {
              printf("  !! Wrong seg-seg connection at point %d.\n",
                     pointmark(pa));
              horrors++;
            }
          }
        }
      }
    }
    pa = pointtraverse();
  }

  if (horrors == 0) {
    printf("  Segments are connected properly.\n");
  } else {
    printf("  !! !! !! !! Found %d missing connections.\n", horrors);
  }
  if (miscount > 0) {
    printf("  !! !! Found %d missing segments.\n", miscount);
  }

  return horrors;
}